

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCEXP.hpp
# Opt level: O0

int __thiscall CCEXP::CCEXPMat<int>::DeleteRow(CCEXPMat<int> *this,size_t row)

{
  char *pcVar1;
  char *local_30;
  char *local_28;
  size_t row_local;
  CCEXPMat<int> *this_local;
  
  if ((this->IgnoreM & 1U) == 0) {
    pcVar1 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                     ,0x2f);
    if (pcVar1 == (char *)0x0) {
      pcVar1 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                       ,0x5c);
      if (pcVar1 == (char *)0x0) {
        local_30 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
        ;
      }
      else {
        local_30 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                           ,0x5c);
        local_30 = local_30 + 1;
      }
      local_28 = local_30;
    }
    else {
      local_28 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                         ,0x2f);
      local_28 = local_28 + 1;
    }
    CECS::RecError((CECS *)CCEXPECS,-9999,1,local_28,0x188,
                   "CCEXPMat::DeleteRow():: DeleteRow() is not supported with \'__CCEXP__USE_VECTOR_INSTEAD_OF_LIST\' enabled!"
                  );
    this_local._4_4_ = -9999;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int CCEXPMat<T>::DeleteRow(size_t row) {
	if (IgnoreM) return 0;
	#ifdef __CCEXP__USE_VECTOR_INSTEAD_OF_LIST
		CECS_ERRI(CCEXPECS, 1, "CCEXPMat::DeleteRow():: DeleteRow() is not supported with '__CCEXP__USE_VECTOR_INSTEAD_OF_LIST' enabled!");
	#else
		const size_t N = data.size();
		CECS_ERRI(CCEXPECS,row >= N,"CCEXPMat::DeleteRow():: Requested Row is not exist yet! (row(=" __ZU__ ") >= N(=" __ZU__ "))", row, N);	
		auto it = std::next(data.begin(), row);
		data.erase(it);
	#endif
	return 0;
}